

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O3

float __thiscall
quantileloss::getRevertingWeight(quantileloss *this,shared_data *sd,float prediction,float eta_t)

{
  uint uVar1;
  float fVar2;
  
  fVar2 = (sd->min_label + sd->max_label) * 0.5;
  uVar1 = -(uint)(fVar2 < prediction);
  return (fVar2 - prediction) /
         ((float)(~uVar1 & (uint)this->tau | (uint)-(1.0 - this->tau) & uVar1) * eta_t);
}

Assistant:

float getRevertingWeight(shared_data* sd, float prediction, float eta_t)
  {
    float v, t;
    t = 0.5f * (sd->min_label + sd->max_label);
    if (prediction > t)
      v = -(1 - tau);
    else
      v = tau;
    return (t - prediction) / (eta_t * v);
  }